

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::convertExpressionListToConstant
          (ConstantFolder *this,Expression *expr,Type *targetType,CommaSeparatedList *list)

{
  Context *errorContext;
  Member *pMVar1;
  Allocator *pAVar2;
  pool_ref<soul::AST::Expression> *ppVar3;
  long *plVar4;
  bool bVar5;
  char cVar6;
  CastType CVar7;
  Constant *pCVar8;
  Structure *this_00;
  Constant *pCVar9;
  CommaSeparatedList *list_00;
  Expression *pEVar10;
  Constant *pCVar11;
  undefined8 extraout_RDX;
  complex<float> v;
  Value *in_R8;
  int iVar12;
  long lVar13;
  bool bVar14;
  float fVar15;
  undefined4 extraout_XMM0_Db;
  complex<double> v_00;
  ArrayView<soul::Value> members;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  pool_ptr<soul::AST::Constant> constant;
  pool_ptr<soul::AST::Constant> imag;
  pool_ptr<soul::AST::Constant> constant_1;
  pool_ptr<soul::AST::Constant> real;
  Type memberType;
  ArrayWithPreallocation<soul::Value,_8UL> memberValues;
  Type local_3b0;
  Constant *local_398;
  Expression *local_390;
  undefined8 local_388;
  Value local_378;
  Expression *local_338;
  Value local_330;
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [24];
  undefined1 local_2b8 [536];
  CompileMessage local_a0;
  CompileMessage local_68;
  
  errorContext = &(expr->super_Statement).super_ASTObject.context;
  pCVar8 = (Constant *)
           TypeRules::checkArraySizeAndThrowErrorIfIllegal<soul::AST::Context&,unsigned_long>
                     (errorContext,(list->items).numActive);
  local_388 = list;
  if (targetType->category == structure) {
    SanityCheckPass::throwErrorIfWrongNumberOfElements(errorContext,targetType,(size_t)pCVar8);
    this_00 = Type::getStructRef(targetType);
    local_2b8._0_8_ = local_2b8 + 0x18;
    local_2b8._8_8_ = (uchar *)0x0;
    local_2b8._16_8_ = (Structure *)0x8;
    ArrayWithPreallocation<soul::Value,_8UL>::reserve
              ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8,(this_00->members).numActive);
    bVar14 = pCVar8 != (Constant *)0x0;
    pCVar9 = pCVar8;
    if (bVar14) {
      lVar13 = 0x10;
      pCVar11 = (Constant *)0x0;
      local_398 = (Constant *)expr;
      local_2f0._24_8_ = pCVar8;
      do {
        if ((Constant *)(this_00->members).numActive <= pCVar11) {
          throwInternalCompilerError("index < numActive","operator[]",0x9f);
        }
        pMVar1 = (this_00->members).items;
        local_330.type._0_4_ = *(undefined4 *)((long)pMVar1 + lVar13 + -0x10);
        local_330.type.primitiveType.type = *(Primitive *)((long)pMVar1 + lVar13 + -0xc);
        local_330.type._8_8_ = *(undefined8 *)((long)pMVar1 + lVar13 + -8);
        local_330.type.structure.object = *(Structure **)(&(pMVar1->type).category + lVar13);
        if (local_330.type.structure.object != (Structure *)0x0) {
          ((local_330.type.structure.object)->super_RefCountedObject).refCount =
               ((local_330.type.structure.object)->super_RefCountedObject).refCount + 1;
        }
        if ((Constant *)(list->items).numActive <= pCVar11) {
          throwInternalCompilerError("index < numActive","operator[]",0x9e);
        }
        (*(((list->items).items[(long)pCVar11].object)->super_Statement).super_ASTObject.
          _vptr_ASTObject[0xd])(&local_3b0);
        plVar4 = (long *)CONCAT44(local_3b0.primitiveType.type,local_3b0._0_4_);
        bVar5 = true;
        if (plVar4 != (long *)0x0) {
          cVar6 = (**(code **)(*plVar4 + 0x80))(plVar4,&local_330);
          if (cVar6 == '\0') {
            if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == false) {
              pEVar10 = (Expression *)CONCAT44(local_3b0.primitiveType.type,local_3b0._0_4_);
              if (pEVar10 == (Expression *)0x0) {
                throwInternalCompilerError("object != nullptr","operator->",0x3c);
              }
              SanityCheckPass::expectSilentCastPossible
                        (&(pEVar10->super_Statement).super_ASTObject.context,&local_330.type,pEVar10
                        );
            }
          }
          else {
            if (CONCAT44(local_3b0.primitiveType.type,local_3b0._0_4_) == 0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            soul::Value::castToTypeExpectingSuccess
                      (&local_378,
                       (Value *)(CONCAT44(local_3b0.primitiveType.type,local_3b0._0_4_) + 0x30),
                       &local_330.type);
            ArrayWithPreallocation<soul::Value,_8UL>::push_back
                      ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8,&local_378);
            soul::Value::~Value(&local_378);
            bVar5 = false;
          }
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(local_330.type.structure.object);
        pCVar9 = local_398;
        if (bVar5) break;
        pCVar11 = (Constant *)
                  ((long)&(pCVar11->super_Expression).super_Statement.super_ASTObject.
                          _vptr_ASTObject + 1);
        bVar14 = pCVar11 < (ulong)local_2f0._24_8_;
        lVar13 = lVar13 + 0x40;
        pCVar9 = pCVar8;
        list = local_388;
      } while ((Constant *)local_2f0._24_8_ != pCVar11);
    }
    if (!bVar14) {
      pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      members.s = (Value *)(local_2b8._8_8_ * 0x40 + local_2b8._0_8_);
      members.e = in_R8;
      soul::Value::createStruct(&local_378,(Value *)this_00,(Structure *)local_2b8._0_8_,members);
      pCVar9 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar2->pool,errorContext,&local_378);
      soul::Value::~Value(&local_378);
    }
    ArrayWithPreallocation<soul::Value,_8UL>::clear
              ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8);
  }
  else {
    if ((targetType->category & ~primitive) == vector) {
      if (pCVar8 != (Constant *)0x1) {
        local_398 = (Constant *)expr;
        SanityCheckPass::throwErrorIfWrongNumberOfElements(errorContext,targetType,(size_t)pCVar8);
        Type::getElementType(&local_330.type,targetType);
        local_2b8._0_8_ = local_2b8 + 0x18;
        local_2b8._8_8_ = (uchar *)0x0;
        local_2b8._16_8_ = (Structure *)0x8;
        ArrayWithPreallocation<soul::Value,_8UL>::reserve
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8,(size_t)pCVar8);
        if (pCVar8 != (Constant *)0x0) {
          pCVar9 = (Constant *)0x0;
          do {
            if ((Constant *)(list->items).numActive <= pCVar9) {
              throwInternalCompilerError("index < numActive","operator[]",0x9e);
            }
            ppVar3 = (list->items).items;
            pEVar10 = ppVar3[(long)pCVar9].object;
            if (pEVar10 == (Expression *)0x0) {
              list_00 = (CommaSeparatedList *)0x0;
            }
            else {
              list_00 = (CommaSeparatedList *)
                        __dynamic_cast(pEVar10,&AST::Expression::typeinfo,
                                       &AST::CommaSeparatedList::typeinfo,0);
            }
            if (list_00 == (CommaSeparatedList *)0x0) {
LAB_00224015:
              iVar12 = 0;
            }
            else {
              pEVar10 = convertExpressionListToConstant
                                  (this,ppVar3[(long)pCVar9].object,&local_330.type,list_00);
              lVar13 = __dynamic_cast(pEVar10,&AST::Expression::typeinfo,&AST::Constant::typeinfo,0)
              ;
              if (lVar13 == 0) goto LAB_00224015;
              soul::Value::castToTypeExpectingSuccess
                        (&local_378,(Value *)(lVar13 + 0x30),&local_330.type);
              ArrayWithPreallocation<soul::Value,_8UL>::push_back
                        ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8,&local_378);
              soul::Value::~Value(&local_378);
              iVar12 = 7;
            }
            list = local_388;
            if (iVar12 == 0) {
              if ((Constant *)(local_388->items).numActive <= pCVar9) {
                throwInternalCompilerError("index < numActive","operator[]",0x9e);
              }
              (*(((local_388->items).items[(long)pCVar9].object)->super_Statement).super_ASTObject.
                _vptr_ASTObject[0xd])(&local_3b0);
              pCVar11 = local_398;
              if ((CONCAT44(local_3b0.primitiveType.type,local_3b0._0_4_) == 0) ||
                 (CVar7 = TypeRules::getCastType
                                    (&local_330.type,
                                     (Type *)(CONCAT44(local_3b0.primitiveType.type,local_3b0._0_4_)
                                             + 0x30)), pCVar11 = local_398, CVar7 == notPossible))
              goto LAB_0022428c;
              if (CONCAT44(local_3b0.primitiveType.type,local_3b0._0_4_) == 0) {
                throwInternalCompilerError("object != nullptr","operator->",0x3c);
              }
              soul::Value::castToTypeExpectingSuccess
                        (&local_378,
                         (Value *)(CONCAT44(local_3b0.primitiveType.type,local_3b0._0_4_) + 0x30),
                         &local_330.type);
              ArrayWithPreallocation<soul::Value,_8UL>::push_back
                        ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8,&local_378);
              soul::Value::~Value(&local_378);
            }
            pCVar9 = (Constant *)
                     ((long)&(pCVar9->super_Expression).super_Statement.super_ASTObject.
                             _vptr_ASTObject + 1);
          } while (pCVar8 != pCVar9);
        }
        if ((targetType->category == array) && (targetType->boundingSize == 0)) {
          pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
          Type::createCopyWithNewArraySize((Type *)local_2d0,targetType,(ArraySize)pCVar8);
          elements.s = (Value *)(local_2b8._8_8_ * 0x40 + local_2b8._0_8_);
          elements.e = in_R8;
          soul::Value::createArrayOrVector
                    (&local_378,(Value *)local_2d0,(Type *)local_2b8._0_8_,elements);
          pCVar11 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                              (&pAVar2->pool,errorContext,&local_378);
          soul::Value::~Value(&local_378);
          RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_2d0._16_8_);
        }
        else {
          if (pCVar8 != (Constant *)0x0) {
            SanityCheckPass::throwErrorIfWrongNumberOfElements
                      (errorContext,targetType,(size_t)pCVar8);
          }
          pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
          local_2f0[0] = targetType->category;
          local_2f0[1] = targetType->arrayElementCategory;
          local_2f0[2] = targetType->isRef;
          local_2f0[3] = targetType->isConstant;
          local_2f0._4_4_ = (targetType->primitiveType).type;
          local_2f0._8_4_ = targetType->boundingSize;
          local_2f0._12_4_ = targetType->arrayElementBoundingSize;
          local_2f0._16_8_ = (targetType->structure).object;
          if ((Structure *)local_2f0._16_8_ != (Structure *)0x0) {
            (((Structure *)local_2f0._16_8_)->super_RefCountedObject).refCount =
                 (((Structure *)local_2f0._16_8_)->super_RefCountedObject).refCount + 1;
          }
          elements_00.s = (Value *)(local_2b8._8_8_ * 0x40 + local_2b8._0_8_);
          elements_00.e = in_R8;
          soul::Value::createArrayOrVector
                    (&local_378,(Value *)local_2f0,(Type *)local_2b8._0_8_,elements_00);
          pCVar11 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                              (&pAVar2->pool,errorContext,&local_378);
          soul::Value::~Value(&local_378);
          RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_2f0._16_8_);
        }
LAB_0022428c:
        ArrayWithPreallocation<soul::Value,_8UL>::clear
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_330.type.structure.object);
        return &pCVar11->super_Expression;
      }
      if ((list->items).numActive == 0) {
LAB_002243e2:
        throwInternalCompilerError("! empty()","front",0xa7);
      }
      (*(((list->items).items)->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                (&local_378);
      if (local_378.type._0_8_ == 0) {
        return expr;
      }
      CVar7 = TypeRules::getCastType(targetType,(Type *)(local_378.type._0_8_ + 0x30));
      if (CVar7 == notPossible) {
        return expr;
      }
      if (local_378.type._0_8_ == 0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      soul::Value::castToTypeExpectingSuccess
                ((Value *)local_2b8,(Value *)(local_378.type._0_8_ + 0x30),targetType);
      pCVar9 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar2->pool,errorContext,(Value *)local_2b8);
    }
    else {
      if ((targetType->primitiveType).type - complex32 < 2) {
        if (pCVar8 != (Constant *)0x2) {
          CompileMessageHelpers::createMessage<>
                    (&local_68,syntax,error,"Too many initialisers for complex number");
          AST::Context::throwError(errorContext,&local_68,false);
        }
        if ((list->items).numActive == 0) {
          throwInternalCompilerError("index < numActive","operator[]",0x9e);
        }
        (*(((list->items).items)->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                  (&local_338);
        if ((list->items).numActive < 2) {
          throwInternalCompilerError("index < numActive","operator[]",0x9e);
        }
        (*(((list->items).items[1].object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                  (&local_390);
        if (local_338 == (Expression *)0x0) {
          return expr;
        }
        if (local_390 == (Expression *)0x0) {
          return expr;
        }
        local_3b0.primitiveType.type = (targetType->primitiveType).type == complex32 ^ float64;
        local_3b0.category = primitive;
        local_3b0.arrayElementCategory = invalid;
        local_3b0.isRef = false;
        local_3b0.isConstant = false;
        local_3b0.boundingSize = 0;
        local_3b0.arrayElementBoundingSize = 0;
        local_3b0.structure.object = (Structure *)0x0;
        SanityCheckPass::expectSilentCastPossible
                  (&(local_338->super_Statement).super_ASTObject.context,&local_3b0,local_338);
        if (local_390 == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        SanityCheckPass::expectSilentCastPossible
                  (&(local_390->super_Statement).super_ASTObject.context,&local_3b0,local_390);
        if (local_338 == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        soul::Value::castToTypeExpectingSuccess
                  ((Value *)local_2b8,(Value *)(local_338 + 1),&local_3b0);
        if (local_390 != (Expression *)0x0) {
          v._M_value = (_ComplexT)(local_390 + 1);
          soul::Value::castToTypeExpectingSuccess(&local_378,(Value *)v._M_value,&local_3b0);
          if ((targetType->primitiveType).type == complex32) {
            fVar15 = soul::Value::getAsFloat((Value *)local_2b8);
            local_388 = (CommaSeparatedList *)CONCAT44(extraout_XMM0_Db,fVar15);
            soul::Value::getAsFloat(&local_378);
            soul::Value::Value(&local_330,v);
          }
          else {
            local_388 = (CommaSeparatedList *)soul::Value::getAsDouble((Value *)local_2b8);
            soul::Value::getAsDouble(&local_378);
            v_00._M_value._8_8_ = extraout_RDX;
            v_00._M_value._0_8_ = v._M_value;
            soul::Value::Value(&local_330,v_00);
          }
          pCVar8 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value&>
                             (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                              errorContext,&local_330);
          soul::Value::~Value(&local_330);
          soul::Value::~Value(&local_378);
          soul::Value::~Value((Value *)local_2b8);
          RefCountedPtr<soul::Structure>::decIfNotNull(local_3b0.structure.object);
          return &pCVar8->super_Expression;
        }
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      if ((Constant *)0x1 < pCVar8) {
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,
                   "You can only create a multi-value initialiser list for an array, vector or struct"
                  );
        AST::Context::throwError(errorContext,&local_a0,false);
      }
      if ((list->items).numActive == 0) goto LAB_002243e2;
      (*(((list->items).items)->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                (&local_378);
      if (local_378.type._0_8_ == 0) {
        return expr;
      }
      CVar7 = TypeRules::getCastType(targetType,(Type *)(local_378.type._0_8_ + 0x30));
      if (CVar7 == notPossible) {
        return expr;
      }
      if (local_378.type._0_8_ == 0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      soul::Value::castToTypeExpectingSuccess
                ((Value *)local_2b8,(Value *)(local_378.type._0_8_ + 0x30),targetType);
      pCVar9 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar2->pool,errorContext,(Value *)local_2b8);
    }
    soul::Value::~Value((Value *)local_2b8);
  }
  return &pCVar9->super_Expression;
}

Assistant:

AST::Expression& convertExpressionListToConstant (AST::Expression& expr, soul::Type& targetType, AST::CommaSeparatedList& list) const
        {
            auto numArgs = TypeRules::checkArraySizeAndThrowErrorIfIllegal (expr.context, list.items.size());

            if (targetType.isStruct())
            {
                SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                auto& s = targetType.getStructRef();

                ArrayWithPreallocation<Value, 8> memberValues;
                memberValues.reserve (s.getNumMembers());

                for (size_t i = 0; i < numArgs; ++i)
                {
                    auto memberType = s.getMemberType (i);

                    if (auto constant = list.items[i]->getAsConstant())
                    {
                        if (constant->canSilentlyCastTo (memberType))
                        {
                            memberValues.push_back (constant->value.castToTypeExpectingSuccess (memberType));
                            continue;
                        }

                        if (! ignoreErrors)
                            SanityCheckPass::expectSilentCastPossible (constant->context, memberType, *constant);
                    }

                    return expr;
                }

                return allocator.allocate<AST::Constant> (expr.context, Value::createStruct (s, memberValues));
            }
            else if (targetType.isArrayOrVector())
            {
                if (numArgs == 1)
                {
                    if (auto constant = list.items.front()->getAsConstant())
                        if (TypeRules::canCastTo (targetType, constant->value.getType()))
                            return allocator.allocate<AST::Constant> (expr.context, constant->value.castToTypeExpectingSuccess (targetType));

                    return expr;
                }

                SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                auto elementType = targetType.getElementType();

                ArrayWithPreallocation<Value, 8> elementValues;
                elementValues.reserve (numArgs);

                for (size_t i = 0; i < numArgs; ++i)
                {
                    if (auto itemList = cast<AST::CommaSeparatedList> (list.items[i]))
                    {
                        auto& e = convertExpressionListToConstant (list.items[i], elementType, *itemList);

                        if (auto constant = cast<AST::Constant> (e))
                        {
                            elementValues.push_back (constant->value.castToTypeExpectingSuccess (elementType));
                            continue;
                        }
                    }

                    if (auto constant = list.items[i]->getAsConstant())
                    {
                        if (TypeRules::canCastTo (elementType, constant->value.getType()))
                        {
                            elementValues.push_back (constant->value.castToTypeExpectingSuccess (elementType));
                            continue;
                        }
                    }

                    return expr;
                }

                if (targetType.isUnsizedArray())
                    return allocator.allocate<AST::Constant> (expr.context, Value::createArrayOrVector (targetType.createCopyWithNewArraySize (numArgs),
                                                                                                     elementValues));

                if (numArgs > 1)
                    SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                return allocator.allocate<AST::Constant> (expr.context, Value::createArrayOrVector (targetType, elementValues));
            }
            else if (targetType.isComplex())
            {
                if (numArgs != 2)
                    expr.context.throwError (Errors::wrongNumberOfComplexInitialisers());

                auto real = list.items[0]->getAsConstant();
                auto imag = list.items[1]->getAsConstant();

                if (real == nullptr || imag == nullptr)
                    return expr;

                auto attributeType = Type (targetType.isComplex32() ? PrimitiveType::float32 : PrimitiveType::float64);

                SanityCheckPass::expectSilentCastPossible (real->context, attributeType, *real);
                SanityCheckPass::expectSilentCastPossible (imag->context, attributeType, *imag);

                auto realValue = real->value.castToTypeExpectingSuccess (attributeType);
                auto imagValue = imag->value.castToTypeExpectingSuccess (attributeType);

                auto value = targetType.isComplex32() ? Value (std::complex<float> (realValue.getAsFloat(), imagValue.getAsFloat()))
                                                      : Value (std::complex<double> (realValue.getAsDouble(), imagValue.getAsDouble()));

                return allocator.allocate<AST::Constant> (expr.context, value);
            }

            if (numArgs > 1)
                expr.context.throwError (Errors::wrongTypeForInitialiseList());

            if (auto constant = list.items.front()->getAsConstant())
                if (TypeRules::canCastTo (targetType, constant->value.getType()))
                    return allocator.allocate<AST::Constant> (expr.context, constant->value.castToTypeExpectingSuccess (targetType));

            return expr;
        }